

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O1

void av1_build_compound_diffwtd_mask_d16_c
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,CONV_BUF_TYPE *src0,int src0_stride,
               CONV_BUF_TYPE *src1,int src1_stride,int h,int w,ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  byte bVar2;
  int iVar3;
  undefined7 in_register_00000031;
  ulong uVar4;
  ushort uVar5;
  int iVar6;
  ulong uVar7;
  
  iVar3 = (int)CONCAT71(in_register_00000031,mask_type);
  if (iVar3 == 1) {
    if (0 < h) {
      bVar2 = ((char)bd - ((char)conv_params->round_0 + (char)conv_params->round_1)) + 6;
      uVar7 = 0;
      do {
        if (0 < w) {
          uVar4 = 0;
          do {
            uVar1 = (ushort)((uint)src0[uVar4] - (uint)src1[uVar4]);
            uVar5 = -uVar1;
            if (0 < (int)((uint)src0[uVar4] - (uint)src1[uVar4])) {
              uVar5 = uVar1;
            }
            iVar6 = (int)((uint)uVar5 + ((1 << (bVar2 & 0x1f)) >> 1)) >> (bVar2 & 0x1f);
            iVar3 = iVar6 + 0xf;
            if (-1 < iVar6) {
              iVar3 = iVar6;
            }
            iVar3 = iVar3 >> 4;
            if (0x19 < iVar3) {
              iVar3 = 0x1a;
            }
            if (iVar3 < -0x25) {
              iVar3 = -0x26;
            }
            mask[uVar4] = '\x1a' - (char)iVar3;
            uVar4 = uVar4 + 1;
          } while ((uint)w != uVar4);
        }
        uVar7 = uVar7 + 1;
        mask = mask + w;
        src1 = src1 + src1_stride;
        src0 = src0 + src0_stride;
      } while (uVar7 != (uint)h);
    }
  }
  else if ((iVar3 == 0) && (0 < h)) {
    bVar2 = ((char)bd - ((char)conv_params->round_0 + (char)conv_params->round_1)) + 6;
    uVar7 = 0;
    do {
      if (0 < w) {
        uVar4 = 0;
        do {
          uVar1 = (ushort)((uint)src0[uVar4] - (uint)src1[uVar4]);
          uVar5 = -uVar1;
          if (0 < (int)((uint)src0[uVar4] - (uint)src1[uVar4])) {
            uVar5 = uVar1;
          }
          iVar6 = (int)((uint)uVar5 + ((1 << (bVar2 & 0x1f)) >> 1)) >> (bVar2 & 0x1f);
          iVar3 = iVar6 + 0xf;
          if (-1 < iVar6) {
            iVar3 = iVar6;
          }
          iVar3 = iVar3 >> 4;
          if (0x19 < iVar3) {
            iVar3 = 0x1a;
          }
          if (iVar3 < -0x25) {
            iVar3 = -0x26;
          }
          mask[uVar4] = (char)iVar3 + '&';
          uVar4 = uVar4 + 1;
        } while ((uint)w != uVar4);
      }
      uVar7 = uVar7 + 1;
      mask = mask + w;
      src1 = src1 + src1_stride;
      src0 = src0 + src0_stride;
    } while (uVar7 != (uint)h);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_d16_c(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const CONV_BUF_TYPE *src0,
    int src0_stride, const CONV_BUF_TYPE *src1, int src1_stride, int h, int w,
    ConvolveParams *conv_params, int bd) {
  switch (mask_type) {
    case DIFFWTD_38:
      diffwtd_mask_d16(mask, 0, 38, src0, src0_stride, src1, src1_stride, h, w,
                       conv_params, bd);
      break;
    case DIFFWTD_38_INV:
      diffwtd_mask_d16(mask, 1, 38, src0, src0_stride, src1, src1_stride, h, w,
                       conv_params, bd);
      break;
    default: assert(0);
  }
}